

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFFormFieldObjectHelper::getDefaultResources(QPDFFormFieldObjectHelper *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  QPDFObjectHandle QVar1;
  allocator<char> local_39;
  string local_38 [40];
  QPDFFormFieldObjectHelper *this_local;
  
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"/DR",&local_39);
  getFieldFromAcroForm(this,in_RSI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFormFieldObjectHelper::getDefaultResources()
{
    return getFieldFromAcroForm("/DR");
}